

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

bool __thiscall
Fossilize::FeatureFilter::Impl::stage_limits_are_supported
          (Impl *this,VkPipelineShaderStageCreateInfo *info)

{
  VkShaderStageFlagBits VVar1;
  VkSpecializationInfo *pVVar2;
  VkSpecializationMapEntry *pVVar3;
  int iVar4;
  long lVar5;
  const_iterator cVar6;
  VkBaseInStructure *sin;
  long lVar7;
  int *piVar8;
  uint uVar9;
  uint32_t *puVar10;
  bool bVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  DeferredEntryPoint *entry;
  uint32_t wg_size [3];
  uint32_t limit_workgroup_size [3];
  uint local_50 [4];
  undefined8 local_40;
  uint32_t local_38;
  uint local_34;
  
  if (info->pName == (char *)0x0) {
    return false;
  }
  VVar1 = info->stage;
  if (VVar1 == VK_SHADER_STAGE_MESH_BIT_EXT) {
    local_38 = (this->props).mesh_shader.maxMeshWorkGroupSize[2];
    local_40 = *(undefined8 *)(this->props).mesh_shader.maxMeshWorkGroupSize;
    iVar14 = 0x14f5;
    lVar5 = 0x1324;
  }
  else if (VVar1 == VK_SHADER_STAGE_TASK_BIT_EXT) {
    local_38 = (this->props).mesh_shader.maxTaskWorkGroupSize[2];
    local_40 = *(undefined8 *)(this->props).mesh_shader.maxTaskWorkGroupSize;
    iVar14 = 0x14f4;
    lVar5 = 0x12f8;
  }
  else {
    if (VVar1 != VK_SHADER_STAGE_COMPUTE_BIT) {
      return true;
    }
    local_38 = (this->props2).properties.limits.maxComputeWorkGroupSize[2];
    local_40 = *(undefined8 *)(this->props2).properties.limits.maxComputeWorkGroupSize;
    iVar14 = 5;
    lVar5 = 0x268;
  }
  uVar9 = *(uint *)((this->props2).properties.deviceName + lVar5 + -0x6c);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->module_to_info_lock);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  cVar6 = std::
          _Hashtable<VkShaderModule_T_*,_std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_std::allocator<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>_>,_std::__detail::_Select1st,_std::equal_to<VkShaderModule_T_*>,_std::hash<VkShaderModule_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->module_to_info)._M_h,&info->module);
  bVar11 = true;
  if (cVar6.
      super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
      ._M_cur != (__node_type *)0x0) {
    lVar7 = *(long *)((long)cVar6.
                            super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
                            ._M_cur + 0x18);
    local_34 = uVar9;
    for (lVar5 = *(long *)((long)cVar6.
                                 super__Node_iterator_base<std::pair<VkShaderModule_T_*const,_Fossilize::FeatureFilter::Impl::ModuleInfo>,_false>
                                 ._M_cur + 0x10); lVar5 != lVar7; lVar5 = lVar5 + 0x60) {
      if ((iVar14 == *(int *)(lVar5 + 0x50)) &&
         (iVar4 = std::__cxx11::string::compare((char *)(lVar5 + 0x30)), iVar4 == 0)) {
        local_50[2] = 0;
        local_50[0] = 0;
        local_50[1] = 0;
        if ((*(int *)(lVar5 + 0x50) == 0x14f5) &&
           (((this->props).mesh_shader.maxMeshOutputPrimitives < *(uint *)(lVar5 + 0x58) ||
            ((this->props).mesh_shader.maxMeshOutputVertices < *(uint *)(lVar5 + 0x54)))))
        goto LAB_0019390a;
        pVVar2 = info->pSpecializationInfo;
        lVar7 = 0;
        goto LAB_0019387f;
      }
    }
  }
  goto LAB_00193910;
  while (lVar7 = lVar7 + 1, lVar7 != 3) {
LAB_0019387f:
    uVar9 = *(uint *)(lVar5 + 4 + lVar7 * 4);
    local_50[lVar7] = uVar9;
    if (((pVVar2 != (VkSpecializationInfo *)0x0 & *(byte *)(lVar5 + 0x28 + lVar7)) == 1) &&
       ((ulong)pVVar2->mapEntryCount != 0)) {
      pVVar3 = pVVar2->pMapEntries;
      lVar12 = 0;
      do {
        if (((*(int *)((long)&pVVar3->constantID + lVar12) == *(int *)(lVar5 + 0x1c + lVar7 * 4)) &&
            (*(long *)((long)&pVVar3->size + lVar12) == 4)) &&
           (uVar13 = (ulong)*(uint *)((long)&pVVar3->offset + lVar12),
           uVar13 + 4 <= pVVar2->dataSize)) {
          uVar9 = *(uint *)((long)pVVar2->pData + uVar13);
          local_50[lVar7] = uVar9;
          break;
        }
        lVar12 = lVar12 + 0x10;
      } while ((ulong)pVVar2->mapEntryCount << 4 != lVar12);
    }
    if (*(uint *)((long)&local_40 + lVar7 * 4) < uVar9) goto LAB_0019390a;
  }
  if (local_50[1] * local_50[0] * local_50[2] <= local_34) {
    if ((info->flags & 2) == 0) goto LAB_00193910;
    for (piVar8 = (int *)info->pNext; piVar8 != (int *)0x0; piVar8 = *(int **)(piVar8 + 2)) {
      if (*piVar8 == 0x3b9e38e9) goto LAB_00193949;
    }
    piVar8 = (int *)0x0;
LAB_00193949:
    puVar10 = &(this->props).subgroup_size_control.maxSubgroupSize;
    if (piVar8 != (int *)0x0) {
      puVar10 = (uint32_t *)(piVar8 + 4);
    }
    if ((*puVar10 != 0) && (local_50[0] % *puVar10 == 0)) goto LAB_00193910;
  }
LAB_0019390a:
  bVar11 = false;
LAB_00193910:
  pthread_mutex_unlock((pthread_mutex_t *)&this->module_to_info_lock);
  return bVar11;
}

Assistant:

bool FeatureFilter::Impl::stage_limits_are_supported(const VkPipelineShaderStageCreateInfo &info) const
{
	spv::ExecutionModel target_model;
	uint32_t limit_workgroup_size[3];
	uint32_t limit_invocations;

	if (!info.pName)
		return false;

	switch (info.stage)
	{
	case VK_SHADER_STAGE_COMPUTE_BIT:
		target_model = spv::ExecutionModelGLCompute;
		memcpy(limit_workgroup_size, props2.properties.limits.maxComputeWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props2.properties.limits.maxComputeWorkGroupInvocations;
		break;

	case VK_SHADER_STAGE_TASK_BIT_EXT:
		target_model = spv::ExecutionModelTaskEXT;
		memcpy(limit_workgroup_size, props.mesh_shader.maxTaskWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props.mesh_shader.maxTaskWorkGroupInvocations;
		break;

	case VK_SHADER_STAGE_MESH_BIT_EXT:
		target_model = spv::ExecutionModelMeshEXT;
		memcpy(limit_workgroup_size, props.mesh_shader.maxMeshWorkGroupSize, sizeof(limit_workgroup_size));
		limit_invocations = props.mesh_shader.maxMeshWorkGroupInvocations;
		break;

	default:
		// Shouldn't happen. Only happens for invalid input.
		return true;
	}

	std::lock_guard<std::mutex> holder{module_to_info_lock};

	// If we cannot find anything, assume that we're statically okay.
	auto itr = module_to_info.find(info.module);
	if (itr == module_to_info.end())
		return true;

	const DeferredEntryPoint *deferred_entry_point = nullptr;
	for (auto &entry : itr->second.deferred_entry_points)
	{
		if (target_model == entry.execution_model && entry.name == info.pName)
		{
			deferred_entry_point = &entry;
			break;
		}
	}

	if (deferred_entry_point)
	{
		auto &entry = *deferred_entry_point;
		uint32_t wg_size[3] = {};

		if (entry.execution_model == spv::ExecutionModelMeshEXT)
		{
			if (entry.max_primitives > props.mesh_shader.maxMeshOutputPrimitives)
				return false;
			if (entry.max_vertices > props.mesh_shader.maxMeshOutputVertices)
				return false;
		}

		for (unsigned i = 0; i < 3; i++)
		{
			wg_size[i] = entry.wg_size_literal[i];
			if (entry.has_constant_id[i] && info.pSpecializationInfo)
			{
				auto *data = static_cast<const uint8_t *>(info.pSpecializationInfo->pData);
				for (unsigned j = 0; j < info.pSpecializationInfo->mapEntryCount; j++)
				{
					auto &map_entry = info.pSpecializationInfo->pMapEntries[j];
					if (map_entry.constantID == entry.constant_id[i] &&
					    map_entry.size == sizeof(uint32_t) &&
					    map_entry.offset + sizeof(uint32_t) <= info.pSpecializationInfo->dataSize)
					{
						memcpy(&wg_size[i], data + map_entry.offset, sizeof(uint32_t));
						break;
					}
				}
			}

			if (wg_size[i] > limit_workgroup_size[i])
				return false;
		}

		if (wg_size[0] * wg_size[1] * wg_size[2] > limit_invocations)
			return false;

		if (info.flags & VK_PIPELINE_SHADER_STAGE_CREATE_REQUIRE_FULL_SUBGROUPS_BIT)
		{
			auto *required = find_pnext<VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT>(
					VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT,
					info.pNext);

			uint32_t target_subgroup_size = required ?
					required->requiredSubgroupSize : props.subgroup_size_control.maxSubgroupSize;

			if (!target_subgroup_size)
				return false;

			if (wg_size[0] % target_subgroup_size != 0)
			{
				// Can only use full subgroups if we're guaranteed maxSubgroupSize is contained.
				// If we're using required size, we can statically validate it.
				return false;
			}
		}
	}

	return true;
}